

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::scoped_padder::scoped_padder
          (scoped_padder *this,size_t wrapped_size,padding_info *padinfo,memory_buf_t *dest)

{
  size_t sVar1;
  ulong count;
  long lVar2;
  
  this->padinfo_ = padinfo;
  this->dest_ = dest;
  (this->spaces_).data_ = "                                                                ";
  (this->spaces_).size_ = 0x40;
  sVar1 = padinfo->width_;
  count = sVar1 - wrapped_size;
  this->remaining_pad_ = count;
  if (count != 0 && (long)wrapped_size <= (long)sVar1) {
    if (padinfo->side_ == center) {
      pad_it(this,count >> 1);
      lVar2 = (ulong)((uint)count & 1) + (count >> 1);
    }
    else {
      if (padinfo->side_ != left) {
        return;
      }
      pad_it(this,count);
      lVar2 = 0;
    }
    this->remaining_pad_ = lVar2;
  }
  return;
}

Assistant:

scoped_padder(size_t wrapped_size, const padding_info &padinfo, memory_buf_t &dest)
        : padinfo_(padinfo)
        , dest_(dest)
    {
        remaining_pad_ = static_cast<long>(padinfo.width_) - static_cast<long>(wrapped_size);
        if (remaining_pad_ <= 0)
        {
            return;
        }

        if (padinfo_.side_ == padding_info::left)
        {
            pad_it(remaining_pad_);
            remaining_pad_ = 0;
        }
        else if (padinfo_.side_ == padding_info::center)
        {
            auto half_pad = remaining_pad_ / 2;
            auto reminder = remaining_pad_ & 1;
            pad_it(half_pad);
            remaining_pad_ = half_pad + reminder; // for the right side
        }
    }